

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_vector.h
# Opt level: O3

void __thiscall
JetHead::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
sizeup(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,uint newSize)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  long *plVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  ulong uVar8;
  long lVar9;
  
  uVar8 = 0x20;
  if (this->mAllocated != 0) {
    uVar8 = (ulong)(this->mAllocated * 2);
  }
  if (newSize != 0) {
    uVar8 = (ulong)newSize;
  }
  pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           operator_new__(uVar8 << 5);
  pbVar7 = this->mData;
  if (pbVar7 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (this->mSize != 0) {
      lVar9 = 0x10;
      uVar6 = 0;
      pbVar7 = pbVar4;
      do {
        pbVar1 = this->mData;
        (pbVar7->_M_dataplus)._M_p = (pointer)&pbVar7->field_2;
        lVar2 = *(long *)((long)pbVar1 + lVar9 + -0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)pbVar7,lVar2,*(long *)((long)pbVar1 + lVar9 + -8) + lVar2);
        plVar3 = *(long **)((long)this->mData + lVar9 + -0x10);
        plVar5 = (long *)((long)&(this->mData->_M_dataplus)._M_p + lVar9);
        if (plVar5 != plVar3) {
          operator_delete(plVar3,*plVar5 + 1);
        }
        uVar6 = uVar6 + 1;
        pbVar7 = pbVar7 + 1;
        lVar9 = lVar9 + 0x20;
      } while (uVar6 < this->mSize);
      pbVar7 = this->mData;
      if (pbVar7 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      goto LAB_0011b2cb;
    }
    operator_delete__(pbVar7);
  }
LAB_0011b2cb:
  this->mData = pbVar4;
  this->mAllocated = (uint)uVar8;
  return;
}

Assistant:

void sizeup(unsigned newSize=0)
		{
			// No size was specified, double the existing size.
			// Doubling a self-expanding array means that storing O(n) 
			// elements takes O(n lg n) worst case.  Adding only a 
			// constant number of elements makes that O(n^2).
			if (newSize == 0) 
			{
				// If we allocated ANYTHING yet, then double it, if 
				// not just use the default size.
				if (mAllocated)
				{
					newSize = mAllocated * 2;
				} else {
					newSize = DEFAULT_ALLOCATION;
				}
			}

			// A new buffer
			T* temp = (T*)(new uint8_t[sizeof(T) * newSize]);

			// If we had data, copy it over
			if (mData)
			{
				// Move all of my data into the new buffer (copy then delete)
				for (unsigned i = 0; i < mSize; i++)
				{
					new(temp + i) T(mData[i]);
					mData[i].~T();
				}
				
				// Delete old buffer
				delete[] (uint8_t*)mData;
			}
			
			// Keep new buffer
			mData = temp;

			// Remember new allocation size
			mAllocated = newSize;
		}